

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O2

size_t Assimp::Write<aiQuaterniont<float>>(IOStream *stream,aiQuaternion *v)

{
  (*stream->_vptr_IOStream[3])(stream,v,4,1);
  (*stream->_vptr_IOStream[3])(stream,&v->x,4,1);
  (*stream->_vptr_IOStream[3])(stream,&v->y,4,1);
  (*stream->_vptr_IOStream[3])(stream,&v->z,4,1);
  return 0x10;
}

Assistant:

inline
size_t Write<aiQuaternion>(IOStream * stream, const aiQuaternion& v) {
    size_t t = Write<float>(stream,v.w);
    t += Write<float>(stream,v.x);
    t += Write<float>(stream,v.y);
    t += Write<float>(stream,v.z);
    ai_assert(t == 16);

    return 16;
}